

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O0

ecs_entity_t * ecs_bulk_new_w_type(ecs_world_t *world,ecs_type_t type,int32_t count)

{
  _Bool _Var1;
  ecs_stage_t *stage_00;
  ecs_table_t *table_00;
  ecs_entities_t eVar2;
  ecs_table_t *table;
  ecs_entities_t components;
  ecs_entity_t *ids;
  ecs_stage_t *stage;
  int32_t count_local;
  ecs_type_t type_local;
  ecs_world_t *world_local;
  
  type_local = (ecs_type_t)world;
  stage_00 = ecs_get_stage((ecs_world_t **)&type_local);
  eVar2 = ecs_type_to_entities(type);
  table = (ecs_table_t *)eVar2.array;
  components.array._0_4_ = eVar2.count;
  _Var1 = ecs_defer_bulk_new((ecs_world_t *)type_local,stage_00,count,(ecs_entities_t *)&table,
                             (void **)0x0,(ecs_entity_t **)&components.count);
  if (_Var1) {
    world_local = (ecs_world_t *)components._8_8_;
  }
  else {
    table_00 = ecs_table_from_type((ecs_world_t *)type_local,type);
    components._8_8_ =
         new_w_data((ecs_world_t *)type_local,table_00,(ecs_entities_t *)0x0,count,(void **)0x0,
                    (int32_t *)0x0);
    ecs_defer_flush((ecs_world_t *)type_local,stage_00);
    world_local = (ecs_world_t *)components._8_8_;
  }
  return (ecs_entity_t *)world_local;
}

Assistant:

const ecs_entity_t* ecs_bulk_new_w_type(
    ecs_world_t *world,
    ecs_type_t type,
    int32_t count)
{
    ecs_stage_t *stage = ecs_get_stage(&world);
    const ecs_entity_t *ids;
    ecs_entities_t components = ecs_type_to_entities(type);
    if (ecs_defer_bulk_new(world, stage, count, &components, NULL, &ids)) {
        return ids;
    }
    ecs_table_t *table = ecs_table_from_type(world, type);
    ids = new_w_data(world, table, NULL, count, NULL, NULL);
    ecs_defer_flush(world, stage);
    return ids;
}